

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

int SSL_set1_ech_config_list(SSL *ssl,uint8_t *ech_config_list,size_t ech_config_list_len)

{
  bool bVar1;
  uint uVar2;
  ptrdiff_t _Num;
  Array<unsigned_char> *this;
  Span<const_unsigned_char> ech_config_list_00;
  
  if ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl == (SSL_CONFIG *)0x0) {
    uVar2 = 0;
  }
  else {
    ech_config_list_00.size_ = ech_config_list_len;
    ech_config_list_00.data_ = (uchar *)ech_config_list_len;
    bVar1 = bssl::ssl_is_valid_ech_config_list((bssl *)ech_config_list,ech_config_list_00);
    if (bVar1) {
      this = &((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
              client_ech_config_list;
      bVar1 = bssl::Array<unsigned_char>::InitUninitialized(this,ech_config_list_len);
      if (ech_config_list_len != 0 && bVar1) {
        memmove(this->data_,ech_config_list,ech_config_list_len);
      }
      uVar2 = (uint)bVar1;
    }
    else {
      uVar2 = 0;
      ERR_put_error(0x10,0,0x13e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x39c);
    }
  }
  return uVar2;
}

Assistant:

int SSL_set1_ech_config_list(SSL *ssl, const uint8_t *ech_config_list,
                             size_t ech_config_list_len) {
  if (!ssl->config) {
    return 0;
  }

  auto span = Span(ech_config_list, ech_config_list_len);
  if (!ssl_is_valid_ech_config_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ECH_CONFIG_LIST);
    return 0;
  }
  return ssl->config->client_ech_config_list.CopyFrom(span);
}